

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

int __thiscall arbiter::drivers::Fs::copy(Fs *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  ArbiterError *pAVar4;
  streambuf *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  ostream local_500 [8];
  ofstream outstream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  istream local_2b8 [8];
  ifstream instream;
  string local_b0;
  string local_90;
  string local_60;
  string local_40;
  EVP_PKEY_CTX *local_20;
  string *dst_local;
  string *src_local;
  Fs *this_local;
  
  local_20 = src;
  dst_local = (string *)dst;
  src_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_60,(string *)dst);
  expandTilde(&local_40,&local_60);
  ::std::__cxx11::string::operator=((string *)dst,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)src);
  expandTilde(&local_90,&local_b0);
  ::std::__cxx11::string::operator=((string *)src,(string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_b0);
  _Var2 = ::std::operator|(_S_in,_S_bin);
  ::std::ifstream::ifstream(local_2b8,(string *)dst,_Var2);
  bVar1 = ::std::ios::good();
  if ((bVar1 & 1) == 0) {
    pAVar4 = (ArbiterError *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_2f8,"Could not open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dst);
    ::std::operator+(&local_2d8,&local_2f8," for reading");
    ArbiterError::ArbiterError(pAVar4,&local_2d8);
    __cxa_throw(pAVar4,&ArbiterError::typeinfo,ArbiterError::~ArbiterError);
  }
  ::std::istream::operator>>(local_2b8,::std::noskipws);
  ::std::ofstream::ofstream(local_500,(string *)src,_S_trunc|_S_out|_S_bin);
  bVar1 = ::std::ios::good();
  if ((bVar1 & 1) == 0) {
    pAVar4 = (ArbiterError *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_540,"Could not open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src);
    ::std::operator+(&local_520,&local_540," for writing");
    ArbiterError::ArbiterError(pAVar4,&local_520);
    __cxa_throw(pAVar4,&ArbiterError::typeinfo,ArbiterError::~ArbiterError);
  }
  psVar5 = (streambuf *)::std::ifstream::rdbuf();
  ::std::ostream::operator<<(local_500,psVar5);
  ::std::ofstream::~ofstream(local_500);
  iVar3 = ::std::ifstream::~ifstream(local_2b8);
  return iVar3;
}

Assistant:

void Fs::copy(std::string src, std::string dst) const
{
    src = expandTilde(src);
    dst = expandTilde(dst);

    std::ifstream instream(src, std::ifstream::in | std::ifstream::binary);
    if (!instream.good())
    {
        throw ArbiterError("Could not open " + src + " for reading");
    }
    instream >> std::noskipws;

    std::ofstream outstream(dst, binaryTruncMode);
    if (!outstream.good())
    {
        throw ArbiterError("Could not open " + dst + " for writing");
    }

    outstream << instream.rdbuf();
}